

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

ostream * vkt::sr::anon_unknown_0::operator<<(ostream *stream,TextureSwizzleComponent comp)

{
  TextureSwizzleComponent comp_local;
  ostream *stream_local;
  
  stream_local = stream;
  switch(comp) {
  case TEXTURESWIZZLECOMPONENT_R:
    stream_local = std::operator<<(stream,"RED");
    break;
  case TEXTURESWIZZLECOMPONENT_G:
    stream_local = std::operator<<(stream,"GREEN");
    break;
  case TEXTURESWIZZLECOMPONENT_B:
    stream_local = std::operator<<(stream,"BLUE");
    break;
  case TEXTURESWIZZLECOMPONENT_A:
    stream_local = std::operator<<(stream,"ALPHA");
    break;
  case TEXTURESWIZZLECOMPONENT_ZERO:
    stream_local = std::operator<<(stream,"ZERO");
    break;
  case TEXTURESWIZZLECOMPONENT_ONE:
    stream_local = std::operator<<(stream,"ONE");
  }
  return stream_local;
}

Assistant:

static std::ostream& operator<< (std::ostream& stream, TextureSwizzleComponent comp)
{
	switch (comp)
	{
		case TEXTURESWIZZLECOMPONENT_R:		return stream << "RED";
		case TEXTURESWIZZLECOMPONENT_G:		return stream << "GREEN";
		case TEXTURESWIZZLECOMPONENT_B:		return stream << "BLUE";
		case TEXTURESWIZZLECOMPONENT_A:		return stream << "ALPHA";
		case TEXTURESWIZZLECOMPONENT_ZERO:	return stream << "ZERO";
		case TEXTURESWIZZLECOMPONENT_ONE:	return stream << "ONE";
		default: DE_ASSERT(false); return stream;
	}
}